

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSampleVariableTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_2::SampleMaskWriteCase::preDraw(SampleMaskWriteCase *this)

{
  ostringstream *this_00;
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  TestError *this_01;
  allocator<char> local_1a1;
  undefined1 local_1a0 [384];
  long lVar3;
  
  iVar1 = (*((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
             super_MultisampleRenderCase.super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext
            [3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  if (*(int *)&(this->super_SampleMaskBaseCase).field_0x12c == 1) {
    iVar1 = (**(code **)(lVar3 + 0xb48))
                      ((((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                         super_MultisampleRenderCase.m_program)->m_program).m_program,"u_mask");
    if (iVar1 == -1) {
      this_01 = (TestError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1a0,"Location of u_mask was -1",&local_1a1);
      tcu::TestError::TestError(this_01,(string *)local_1a0);
      __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    (**(code **)(lVar3 + 0x5e0))(0x8e51);
    (**(code **)(lVar3 + 0x1258))(0,0xaaaaaaaa);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"set mask",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSampleVariableTests.cpp"
                    ,0x803);
    (**(code **)(lVar3 + 0x1500))(iVar1,0xaaaaaaaa);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"set mask uniform",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSampleVariableTests.cpp"
                    ,0x806);
    local_1a0._0_8_ =
         ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.super_MultisampleRenderCase.
          super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
    this_00 = (ostringstream *)(local_1a0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,"Setting sample mask ");
    tcu::Format::operator<<((ostream *)this_00,(Hex<4UL>)0xaaaaaaaa);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
  }
  SampleMaskBaseCase::preDraw(&this->super_SampleMaskBaseCase);
  return;
}

Assistant:

void SampleMaskWriteCase::preDraw (void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (m_testMode == TEST_INVERSE)
	{
		// set mask to 0xAAAA.., set inverse mask bit coverage in shader

		const int		maskLoc	= gl.getUniformLocation(m_program->getProgram(), "u_mask");
		const deUint32	mask	= (deUint32)0xAAAAAAAAUL;

		if (maskLoc == -1)
			throw tcu::TestError("Location of u_mask was -1");

		gl.enable(GL_SAMPLE_MASK);
		gl.sampleMaski(0, mask);
		GLU_EXPECT_NO_ERROR(gl.getError(), "set mask");

		gl.uniform1ui(maskLoc, mask);
		GLU_EXPECT_NO_ERROR(gl.getError(), "set mask uniform");

		m_testCtx.getLog() << tcu::TestLog::Message << "Setting sample mask " << tcu::Format::Hex<4>(mask) << tcu::TestLog::EndMessage;
	}

	SampleMaskBaseCase::preDraw();
}